

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveTree.cpp
# Opt level: O0

void glslang::RemoveAllTreeNodes(TIntermNode *root)

{
  undefined1 local_48 [8];
  TRemoveTraverser it;
  TIntermNode *root_local;
  
  it.super_TIntermTraverser.path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)root;
  TRemoveTraverser::TRemoveTraverser((TRemoveTraverser *)local_48);
  (**(code **)&((*it.super_TIntermTraverser.path.
                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage)->loc).string)
            (it.super_TIntermTraverser.path.
             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,local_48);
  TRemoveTraverser::~TRemoveTraverser((TRemoveTraverser *)local_48);
  return;
}

Assistant:

void RemoveAllTreeNodes(TIntermNode* root)
{
    TRemoveTraverser it;

    root->traverse(&it);
}